

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BurstDescriptor.h
# Opt level: O0

BurstDescriptor * __thiscall
DIS::BurstDescriptor::operator=(BurstDescriptor *this,BurstDescriptor *param_1)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  BurstDescriptor *param_1_local;
  BurstDescriptor *this_local;
  
  EntityType::operator=(&this->_munition,&param_1->_munition);
  uVar1 = param_1->_fuse;
  uVar2 = param_1->_quantity;
  uVar3 = param_1->_rate;
  this->_warhead = param_1->_warhead;
  this->_fuse = uVar1;
  this->_quantity = uVar2;
  this->_rate = uVar3;
  return this;
}

Assistant:

class OPENDIS6_EXPORT BurstDescriptor
{
protected:
  /** What munition was used in the burst */
  EntityType _munition; 

  /** type of warhead */
  unsigned short _warhead; 

  /** type of fuse used */
  unsigned short _fuse; 

  /** how many of the munition were fired */
  unsigned short _quantity; 

  /** rate at which the munition was fired */
  unsigned short _rate; 


 public:
    BurstDescriptor();
    virtual ~BurstDescriptor();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    EntityType& getMunition(); 
    const EntityType&  getMunition() const; 
    void setMunition(const EntityType    &pX);

    unsigned short getWarhead() const; 
    void setWarhead(unsigned short pX); 

    unsigned short getFuse() const; 
    void setFuse(unsigned short pX); 

    unsigned short getQuantity() const; 
    void setQuantity(unsigned short pX); 

    unsigned short getRate() const; 
    void setRate(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const BurstDescriptor& rhs) const;
}